

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bxdfs.cpp
# Opt level: O1

string * __thiscall
pbrt::BxDFHandle::ToString_abi_cxx11_(string *__return_storage_ptr__,BxDFHandle *this)

{
  ulong uVar1;
  ushort uVar2;
  DiffuseBxDF *this_00;
  HairBxDF *this_01;
  
  uVar1 = (this->
          super_TaggedPointer<pbrt::IdealDiffuseBxDF,_pbrt::DiffuseBxDF,_pbrt::CoatedDiffuseBxDF,_pbrt::CoatedConductorBxDF,_pbrt::DielectricInterfaceBxDF,_pbrt::ThinDielectricBxDF,_pbrt::HairBxDF,_pbrt::MeasuredBxDF,_pbrt::ConductorBxDF,_pbrt::NormalizedFresnelBxDF>
          ).bits;
  uVar2 = (ushort)(uVar1 >> 0x30);
  if ((uint)(uVar1 >> 0x31) < 3) {
    this_00 = (DiffuseBxDF *)(uVar1 & 0xffffffffffff);
    if (uVar2 < 3) {
      if (uVar2 == 2) {
        DiffuseBxDF::ToString_abi_cxx11_(__return_storage_ptr__,this_00);
      }
      else {
        IdealDiffuseBxDF::ToString_abi_cxx11_(__return_storage_ptr__,(IdealDiffuseBxDF *)this_00);
      }
    }
    else if (uVar2 == 4) {
      LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::ConductorBxDF>::ToString_abi_cxx11_
                (__return_storage_ptr__,this_00);
    }
    else if (uVar2 == 3) {
      LayeredBxDF<pbrt::DielectricInterfaceBxDF,pbrt::IdealDiffuseBxDF>::ToString_abi_cxx11_
                (__return_storage_ptr__,this_00);
    }
    else {
      DielectricInterfaceBxDF::ToString_abi_cxx11_
                (__return_storage_ptr__,(DielectricInterfaceBxDF *)this_00);
    }
  }
  else {
    this_01 = (HairBxDF *)(uVar1 & 0xffffffffffff);
    if (uVar1 >> 0x33 == 0) {
      if (uVar2 == 7) {
        HairBxDF::ToString_abi_cxx11_(__return_storage_ptr__,this_01);
      }
      else {
        ThinDielectricBxDF::ToString_abi_cxx11_
                  (__return_storage_ptr__,(ThinDielectricBxDF *)this_01);
      }
    }
    else if (uVar1 >> 0x30 == 9) {
      ConductorBxDF::ToString_abi_cxx11_(__return_storage_ptr__,(ConductorBxDF *)this_01);
    }
    else if (uVar2 == 8) {
      MeasuredBxDF::ToString_abi_cxx11_(__return_storage_ptr__,(MeasuredBxDF *)this_01);
    }
    else {
      NormalizedFresnelBxDF::ToString_abi_cxx11_
                (__return_storage_ptr__,(NormalizedFresnelBxDF *)this_01);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::string BxDFHandle::ToString() const {
    auto toStr = [](auto ptr) { return ptr->ToString(); };
    return DispatchCPU(toStr);
}